

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall Parser::parse(Parser *this,QIODevice *input,QString *name)

{
  bool bVar1;
  qsizetype qVar2;
  iterator o;
  int iVar3;
  Parser *in_RDX;
  QString *in_RSI;
  Parser *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<QString_&,_QLatin1Char> QVar4;
  Replace *rep;
  QList<Replace> *__range2;
  Function *func;
  QList<Function> *__range1;
  qsizetype prev;
  int lineNumber;
  char16_t *str_4;
  char16_t *str;
  char16_t *str_1;
  char16_t *str_2;
  char16_t *str_3;
  char16_t *str_5;
  char16_t *str_6;
  iterator __end2;
  iterator __begin2;
  iterator __end1;
  iterator __begin1;
  QString macroType;
  QRegularExpressionMatch match_1;
  QRegularExpression traceMacro;
  QString resolved;
  QString filename;
  QRegularExpressionMatch match;
  QRegularExpressionMatchIterator i;
  QRegularExpression includeMacro;
  QStringList includes;
  QString line;
  QTextStream stream;
  QString data;
  undefined4 in_stack_fffffffffffffbf8;
  CaseSensitivity in_stack_fffffffffffffbfc;
  uint in_stack_fffffffffffffc00;
  byte in_stack_fffffffffffffc04;
  byte in_stack_fffffffffffffc05;
  byte in_stack_fffffffffffffc06;
  byte in_stack_fffffffffffffc07;
  QIODevice *in_stack_fffffffffffffc08;
  QList<LineNumber> *in_stack_fffffffffffffc10;
  QString *in_stack_fffffffffffffc18;
  QList<QString> *in_stack_fffffffffffffc20;
  QStringBuilder<QString_&,_QLatin1Char> *in_stack_fffffffffffffc28;
  QString *in_stack_fffffffffffffc38;
  Parser *in_stack_fffffffffffffc40;
  Parser *in_stack_fffffffffffffc48;
  QString *in_stack_fffffffffffffc50;
  QString *pQVar5;
  undefined4 in_stack_fffffffffffffc60;
  int iVar6;
  Parser *this_00;
  char16_t *includes_00;
  char16_t *offset;
  QArrayDataPointer<char16_t> *data_00;
  Parser *in_stack_fffffffffffffd28;
  iterator local_2c8;
  Function *local_2c0;
  iterator local_2b8;
  iterator local_2b0;
  QArrayDataPointer<char16_t> local_2a8 [2];
  QArrayDataPointer<char16_t> local_278 [2];
  QArrayDataPointer<char16_t> local_248 [2];
  QArrayDataPointer<char16_t> local_218 [2];
  QArrayDataPointer<char16_t> local_1e8 [2];
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  QArrayDataPointer<char16_t> local_180 [2];
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  QLatin1Char local_12b [3];
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_100;
  QArrayDataPointer<char16_t> local_f0 [2];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  QString *local_a0;
  char local_98;
  undefined1 local_89 [17];
  int local_78;
  QIODevice local_70;
  QList<QString> local_58;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  QString *local_18;
  char local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = 0xaaaaaaaaaaaaaaaa;
  local_28 = 0xaaaaaaaaaaaaaaaa;
  local_20 = 0xaaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QString::QString((QString *)0x110375);
  local_38 = 0xaaaaaaaaaaaaaaaa;
  QTextStream::QTextStream((QTextStream *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  pQVar5 = (QString *)0x0;
  iVar6 = 1;
  while (bVar1 = QTextStream::atEnd((QTextStream *)
                                    CONCAT17(in_stack_fffffffffffffc07,
                                             CONCAT16(in_stack_fffffffffffffc06,
                                                      CONCAT15(in_stack_fffffffffffffc05,
                                                               CONCAT14(in_stack_fffffffffffffc04,
                                                                        in_stack_fffffffffffffc00)))
                                            )), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_58.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_58.d.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
    local_58.d.size = -0x5555555555555556;
    in_stack_fffffffffffffc08 = &local_70;
    QTextStream::readLine
              ((QTextStream *)in_stack_fffffffffffffc18,(qint64)in_stack_fffffffffffffc10);
    in_stack_fffffffffffffc20 = &local_58;
    QString::trimmed((QString *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
    in_stack_fffffffffffffc18 = pQVar5;
    QString::~QString((QString *)0x11041f);
    in_stack_fffffffffffffc10 = &in_RDI->m_offsets;
    pQVar5 = in_stack_fffffffffffffc18;
    local_89._1_8_ = in_stack_fffffffffffffc18;
    qVar2 = QString::length((QString *)0x11044e);
    local_89._9_8_ =
         (long)&(((__uniq_ptr_data<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>,_true,_true>
                   *)&(in_stack_fffffffffffffc18->d).d)->
                super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>)
                ._M_t.
                super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>
                .super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl + qVar2;
    iVar3 = iVar6 + 1;
    local_78 = iVar6;
    QList<LineNumber>::push_back
              ((QList<LineNumber> *)
               CONCAT17(in_stack_fffffffffffffc07,
                        CONCAT16(in_stack_fffffffffffffc06,
                                 CONCAT15(in_stack_fffffffffffffc05,
                                          CONCAT14(in_stack_fffffffffffffc04,
                                                   in_stack_fffffffffffffc00)))),
               (rvalue_ref)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
    qVar2 = QString::length((QString *)0x110490);
    pQVar5 = (QString *)
             ((long)&(((__uniq_ptr_data<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>,_true,_true>
                        *)&(pQVar5->d).d)->
                     super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>
                     )._M_t.
                     super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>
                     .super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl + qVar2 + 1);
    in_stack_fffffffffffffc28 = (QStringBuilder<QString_&,_QLatin1Char> *)local_89;
    QLatin1Char::QLatin1Char((QLatin1Char *)in_stack_fffffffffffffc28,'\n');
    QVar4 = ::operator+((QString *)in_stack_fffffffffffffc08,
                        (QLatin1Char *)
                        CONCAT17(in_stack_fffffffffffffc07,
                                 CONCAT16(in_stack_fffffffffffffc06,
                                          CONCAT15(in_stack_fffffffffffffc05,
                                                   CONCAT14(in_stack_fffffffffffffc04,
                                                            in_stack_fffffffffffffc00)))));
    local_a0 = QVar4.a;
    local_98 = (char)QVar4.b.ch;
    local_18 = local_a0;
    local_10 = local_98;
    operator+=((QString *)in_RDI,in_stack_fffffffffffffc28);
    QString::~QString((QString *)0x110514);
    iVar6 = iVar3;
  }
  simplifyData(in_stack_fffffffffffffc50,(QList<LineNumber> *)in_stack_fffffffffffffc48);
  local_b8 = 0xaaaaaaaaaaaaaaaa;
  local_b0 = 0xaaaaaaaaaaaaaaaa;
  local_a8 = 0xaaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x110569);
  local_c0 = 0xaaaaaaaaaaaaaaaa;
  QArrayDataPointer<char16_t>::QArrayDataPointer
            (local_f0,(Data *)0x0,L"#include [\"<]([A-Za-z0-9_./-]*.h)[\">]",0x25);
  QString::QString((QString *)
                   CONCAT17(in_stack_fffffffffffffc07,
                            CONCAT16(in_stack_fffffffffffffc06,
                                     CONCAT15(in_stack_fffffffffffffc05,
                                              CONCAT14(in_stack_fffffffffffffc04,
                                                       in_stack_fffffffffffffc00)))),
                   (DataPointer *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  QFlags<QRegularExpression::PatternOption>::QFlags
            ((QFlags<QRegularExpression::PatternOption> *)
             CONCAT17(in_stack_fffffffffffffc07,
                      CONCAT16(in_stack_fffffffffffffc06,
                               CONCAT15(in_stack_fffffffffffffc05,
                                        CONCAT14(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00
                                                )))),in_stack_fffffffffffffbfc);
  QRegularExpression::QRegularExpression
            ((QRegularExpression *)in_stack_fffffffffffffc10,(QString *)in_stack_fffffffffffffc08,
             (QFlagsStorageHelper<QRegularExpression::PatternOption,_4>)
             SUB84((ulong)in_stack_fffffffffffffc18 >> 0x20,0));
  QString::~QString((QString *)0x110612);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)
             CONCAT17(in_stack_fffffffffffffc07,
                      CONCAT16(in_stack_fffffffffffffc06,
                               CONCAT15(in_stack_fffffffffffffc05,
                                        CONCAT14(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00
                                                )))));
  local_100 = 0xaaaaaaaaaaaaaaaa;
  QFlags<QRegularExpression::MatchOption>::QFlags
            ((QFlags<QRegularExpression::MatchOption> *)
             CONCAT17(in_stack_fffffffffffffc07,
                      CONCAT16(in_stack_fffffffffffffc06,
                               CONCAT15(in_stack_fffffffffffffc05,
                                        CONCAT14(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00
                                                )))),in_stack_fffffffffffffbfc);
  QRegularExpression::globalMatch
            ((QRegularExpression *)in_stack_fffffffffffffc48,(QString *)in_stack_fffffffffffffc40,
             (qsizetype)in_stack_fffffffffffffc38,(MatchType)((ulong)in_RDI >> 0x20),
             (QFlagsStorageHelper<QRegularExpression::MatchOption,_4>)SUB84((ulong)in_RDX >> 0x20,0)
            );
  while (bVar1 = QRegularExpressionMatchIterator::hasNext
                           ((QRegularExpressionMatchIterator *)0x110676), bVar1) {
    local_110 = 0xaaaaaaaaaaaaaaaa;
    QRegularExpressionMatchIterator::next
              ((QRegularExpressionMatchIterator *)in_stack_fffffffffffffc18);
    local_128 = 0xaaaaaaaaaaaaaaaa;
    local_120 = 0xaaaaaaaaaaaaaaaa;
    local_118 = 0xaaaaaaaaaaaaaaaa;
    QRegularExpressionMatch::captured
              ((QRegularExpressionMatch *)in_stack_fffffffffffffc10,
               (int)((ulong)in_stack_fffffffffffffc08 >> 0x20));
    QLatin1Char::QLatin1Char(local_12b,'q');
    QChar::QChar<QLatin1Char,_true>
              ((QChar *)CONCAT17(in_stack_fffffffffffffc07,
                                 CONCAT16(in_stack_fffffffffffffc06,
                                          CONCAT15(in_stack_fffffffffffffc05,
                                                   CONCAT14(in_stack_fffffffffffffc04,
                                                            in_stack_fffffffffffffc00)))),
               (QLatin1Char)(char)((ulong)in_stack_fffffffffffffc08 >> 0x38));
    bVar1 = QString::startsWith((QString *)in_stack_fffffffffffffc08,
                                (QChar)(char16_t)((ulong)in_stack_fffffffffffffc18 >> 0x30),
                                CONCAT13(in_stack_fffffffffffffc07,
                                         CONCAT12(in_stack_fffffffffffffc06,
                                                  CONCAT11(in_stack_fffffffffffffc05,
                                                           in_stack_fffffffffffffc04))));
    if (bVar1) {
      local_148 = 0xaaaaaaaaaaaaaaaa;
      local_140 = 0xaaaaaaaaaaaaaaaa;
      local_138 = 0xaaaaaaaaaaaaaaaa;
      resolveInclude(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
      bVar1 = QString::isEmpty((QString *)0x110785);
      if ((!bVar1) &&
         (bVar1 = QListSpecialMethods<QString>::contains
                            ((QListSpecialMethods<QString> *)in_stack_fffffffffffffc08,
                             (QString *)
                             CONCAT17(in_stack_fffffffffffffc07,
                                      CONCAT16(in_stack_fffffffffffffc06,
                                               CONCAT15(in_stack_fffffffffffffc05,
                                                        CONCAT14(in_stack_fffffffffffffc04,
                                                                 in_stack_fffffffffffffc00)))),
                             in_stack_fffffffffffffbfc), !bVar1)) {
        QList<QString>::push_back
                  ((QList<QString> *)
                   CONCAT17(in_stack_fffffffffffffc07,
                            CONCAT16(in_stack_fffffffffffffc06,
                                     CONCAT15(in_stack_fffffffffffffc05,
                                              CONCAT14(in_stack_fffffffffffffc04,
                                                       in_stack_fffffffffffffc00)))),
                   (parameter_type)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
        addIncludesRecursive(in_RDI,(QString *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
      }
      QString::~QString((QString *)0x1107e3);
    }
    QString::~QString((QString *)0x1107f0);
    QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)0x1107fd);
  }
  local_150 = 0xaaaaaaaaaaaaaaaa;
  QArrayDataPointer<char16_t>::QArrayDataPointer(local_180,(Data *)0x0,L"Q_TRACE_([A-Z_]*)",0x11);
  QString::QString((QString *)
                   CONCAT17(in_stack_fffffffffffffc07,
                            CONCAT16(in_stack_fffffffffffffc06,
                                     CONCAT15(in_stack_fffffffffffffc05,
                                              CONCAT14(in_stack_fffffffffffffc04,
                                                       in_stack_fffffffffffffc00)))),
                   (DataPointer *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  QFlags<QRegularExpression::PatternOption>::QFlags
            ((QFlags<QRegularExpression::PatternOption> *)
             CONCAT17(in_stack_fffffffffffffc07,
                      CONCAT16(in_stack_fffffffffffffc06,
                               CONCAT15(in_stack_fffffffffffffc05,
                                        CONCAT14(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00
                                                )))),in_stack_fffffffffffffbfc);
  QRegularExpression::QRegularExpression
            ((QRegularExpression *)in_stack_fffffffffffffc10,(QString *)in_stack_fffffffffffffc08,
             (QFlagsStorageHelper<QRegularExpression::PatternOption,_4>)
             SUB84((ulong)in_stack_fffffffffffffc18 >> 0x20,0));
  QString::~QString((QString *)0x1108ab);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)
             CONCAT17(in_stack_fffffffffffffc07,
                      CONCAT16(in_stack_fffffffffffffc06,
                               CONCAT15(in_stack_fffffffffffffc05,
                                        CONCAT14(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00
                                                )))));
  QFlags<QRegularExpression::MatchOption>::QFlags
            ((QFlags<QRegularExpression::MatchOption> *)
             CONCAT17(in_stack_fffffffffffffc07,
                      CONCAT16(in_stack_fffffffffffffc06,
                               CONCAT15(in_stack_fffffffffffffc05,
                                        CONCAT14(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00
                                                )))),in_stack_fffffffffffffbfc);
  QRegularExpression::globalMatch
            ((QRegularExpression *)in_stack_fffffffffffffc48,(QString *)in_stack_fffffffffffffc40,
             (qsizetype)in_stack_fffffffffffffc38,(MatchType)((ulong)in_RDI >> 0x20),
             (QFlagsStorageHelper<QRegularExpression::MatchOption,_4>)SUB84((ulong)in_RDX >> 0x20,0)
            );
  QRegularExpressionMatchIterator::operator=
            ((QRegularExpressionMatchIterator *)
             CONCAT17(in_stack_fffffffffffffc07,
                      CONCAT16(in_stack_fffffffffffffc06,
                               CONCAT15(in_stack_fffffffffffffc05,
                                        CONCAT14(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00
                                                )))),
             (QRegularExpressionMatchIterator *)
             CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
            ((QRegularExpressionMatchIterator *)0x110915);
  while (bVar1 = QRegularExpressionMatchIterator::hasNext
                           ((QRegularExpressionMatchIterator *)0x110922), bVar1) {
    local_1a0 = 0xaaaaaaaaaaaaaaaa;
    QRegularExpressionMatchIterator::next
              ((QRegularExpressionMatchIterator *)in_stack_fffffffffffffc18);
    local_1b8 = 0xaaaaaaaaaaaaaaaa;
    local_1b0 = 0xaaaaaaaaaaaaaaaa;
    local_1a8 = 0xaaaaaaaaaaaaaaaa;
    QRegularExpressionMatch::captured
              ((QRegularExpressionMatch *)in_stack_fffffffffffffc10,
               (int)((ulong)in_stack_fffffffffffffc08 >> 0x20));
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_1e8,(Data *)0x0,L"PARAM_REPLACE",0xd);
    QString::QString((QString *)
                     CONCAT17(in_stack_fffffffffffffc07,
                              CONCAT16(in_stack_fffffffffffffc06,
                                       CONCAT15(in_stack_fffffffffffffc05,
                                                CONCAT14(in_stack_fffffffffffffc04,
                                                         in_stack_fffffffffffffc00)))),
                     (DataPointer *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
    in_stack_fffffffffffffc07 =
         ::operator==((QString *)
                      CONCAT17(in_stack_fffffffffffffc07,
                               CONCAT16(in_stack_fffffffffffffc06,
                                        CONCAT15(in_stack_fffffffffffffc05,
                                                 CONCAT14(in_stack_fffffffffffffc04,
                                                          in_stack_fffffffffffffc00)))),
                      (QString *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
    QString::~QString((QString *)0x110a1e);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)
               CONCAT17(in_stack_fffffffffffffc07,
                        CONCAT16(in_stack_fffffffffffffc06,
                                 CONCAT15(in_stack_fffffffffffffc05,
                                          CONCAT14(in_stack_fffffffffffffc04,
                                                   in_stack_fffffffffffffc00)))));
    if ((in_stack_fffffffffffffc07 & 1) == 0) {
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_218,(Data *)0x0,L"INSTRUMENT",10);
      QString::QString((QString *)
                       CONCAT17(in_stack_fffffffffffffc07,
                                CONCAT16(in_stack_fffffffffffffc06,
                                         CONCAT15(in_stack_fffffffffffffc05,
                                                  CONCAT14(in_stack_fffffffffffffc04,
                                                           in_stack_fffffffffffffc00)))),
                       (DataPointer *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8))
      ;
      in_stack_fffffffffffffc06 =
           ::operator==((QString *)
                        CONCAT17(in_stack_fffffffffffffc07,
                                 CONCAT16(in_stack_fffffffffffffc06,
                                          CONCAT15(in_stack_fffffffffffffc05,
                                                   CONCAT14(in_stack_fffffffffffffc04,
                                                            in_stack_fffffffffffffc00)))),
                        (QString *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      QString::~QString((QString *)0x110aeb);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)
                 CONCAT17(in_stack_fffffffffffffc07,
                          CONCAT16(in_stack_fffffffffffffc06,
                                   CONCAT15(in_stack_fffffffffffffc05,
                                            CONCAT14(in_stack_fffffffffffffc04,
                                                     in_stack_fffffffffffffc00)))));
      if ((in_stack_fffffffffffffc06 & 1) == 0) {
        QArrayDataPointer<char16_t>::QArrayDataPointer(local_248,(Data *)0x0,L"POINT",5);
        QString::QString((QString *)
                         CONCAT17(in_stack_fffffffffffffc07,
                                  CONCAT16(in_stack_fffffffffffffc06,
                                           CONCAT15(in_stack_fffffffffffffc05,
                                                    CONCAT14(in_stack_fffffffffffffc04,
                                                             in_stack_fffffffffffffc00)))),
                         (DataPointer *)
                         CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
        in_stack_fffffffffffffc05 =
             ::operator==((QString *)
                          CONCAT17(in_stack_fffffffffffffc07,
                                   CONCAT16(in_stack_fffffffffffffc06,
                                            CONCAT15(in_stack_fffffffffffffc05,
                                                     CONCAT14(in_stack_fffffffffffffc04,
                                                              in_stack_fffffffffffffc00)))),
                          (QString *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
        QString::~QString((QString *)0x110bb3);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)
                   CONCAT17(in_stack_fffffffffffffc07,
                            CONCAT16(in_stack_fffffffffffffc06,
                                     CONCAT15(in_stack_fffffffffffffc05,
                                              CONCAT14(in_stack_fffffffffffffc04,
                                                       in_stack_fffffffffffffc00)))));
        if ((in_stack_fffffffffffffc05 & 1) == 0) {
          QArrayDataPointer<char16_t>::QArrayDataPointer(local_278,(Data *)0x0,L"PREFIX",6);
          QString::QString((QString *)
                           CONCAT17(in_stack_fffffffffffffc07,
                                    CONCAT16(in_stack_fffffffffffffc06,
                                             CONCAT15(in_stack_fffffffffffffc05,
                                                      CONCAT14(in_stack_fffffffffffffc04,
                                                               in_stack_fffffffffffffc00)))),
                           (DataPointer *)
                           CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
          in_stack_fffffffffffffc04 =
               ::operator==((QString *)
                            CONCAT17(in_stack_fffffffffffffc07,
                                     CONCAT16(in_stack_fffffffffffffc06,
                                              CONCAT15(in_stack_fffffffffffffc05,
                                                       CONCAT14(in_stack_fffffffffffffc04,
                                                                in_stack_fffffffffffffc00)))),
                            (QString *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8)
                           );
          QString::~QString((QString *)0x110c7b);
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)
                     CONCAT17(in_stack_fffffffffffffc07,
                              CONCAT16(in_stack_fffffffffffffc06,
                                       CONCAT15(in_stack_fffffffffffffc05,
                                                CONCAT14(in_stack_fffffffffffffc04,
                                                         in_stack_fffffffffffffc00)))));
          if ((in_stack_fffffffffffffc04 & 1) == 0) {
            data_00 = local_2a8;
            offset = L"METADATA";
            includes_00 = L"METADATA";
            QArrayDataPointer<char16_t>::QArrayDataPointer(local_2a8,(Data *)0x0,L"METADATA",8);
            QString::QString((QString *)
                             CONCAT17(in_stack_fffffffffffffc07,
                                      CONCAT16(in_stack_fffffffffffffc06,
                                               CONCAT15(in_stack_fffffffffffffc05,
                                                        CONCAT14(in_stack_fffffffffffffc04,
                                                                 in_stack_fffffffffffffc00)))),
                             (DataPointer *)
                             CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
            bVar1 = ::operator==((QString *)
                                 CONCAT17(in_stack_fffffffffffffc07,
                                          CONCAT16(in_stack_fffffffffffffc06,
                                                   CONCAT15(in_stack_fffffffffffffc05,
                                                            CONCAT14(in_stack_fffffffffffffc04,
                                                                     in_stack_fffffffffffffc00)))),
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
            in_stack_fffffffffffffc00 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc00);
            QString::~QString((QString *)0x110d43);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)
                       CONCAT17(in_stack_fffffffffffffc07,
                                CONCAT16(in_stack_fffffffffffffc06,
                                         CONCAT15(in_stack_fffffffffffffc05,
                                                  CONCAT14(in_stack_fffffffffffffc04,
                                                           in_stack_fffffffffffffc00)))));
            if ((in_stack_fffffffffffffc00 & 0x1000000) != 0) {
              QRegularExpressionMatch::capturedEnd
                        ((QRegularExpressionMatch *)in_stack_fffffffffffffc08,
                         CONCAT13(in_stack_fffffffffffffc07,
                                  CONCAT12(in_stack_fffffffffffffc06,
                                           CONCAT11(in_stack_fffffffffffffc05,
                                                    in_stack_fffffffffffffc04))));
              parseMetadata(in_stack_fffffffffffffd28,(QString *)data_00,(qsizetype)offset,
                            (QStringList *)includes_00);
            }
          }
          else {
            QRegularExpressionMatch::capturedEnd
                      ((QRegularExpressionMatch *)in_stack_fffffffffffffc08,
                       CONCAT13(in_stack_fffffffffffffc07,
                                CONCAT12(in_stack_fffffffffffffc06,
                                         CONCAT11(in_stack_fffffffffffffc05,
                                                  in_stack_fffffffffffffc04))));
            parsePrefix(in_stack_fffffffffffffc48,(QString *)in_stack_fffffffffffffc40,
                        (qsizetype)in_stack_fffffffffffffc38);
          }
        }
        else {
          QRegularExpressionMatch::capturedEnd
                    ((QRegularExpressionMatch *)in_stack_fffffffffffffc08,
                     CONCAT13(in_stack_fffffffffffffc07,
                              CONCAT12(in_stack_fffffffffffffc06,
                                       CONCAT11(in_stack_fffffffffffffc05,in_stack_fffffffffffffc04)
                                      )));
          parsePoint((Parser *)CONCAT44(iVar6,in_stack_fffffffffffffc60),pQVar5,
                     (qsizetype)in_stack_fffffffffffffc50);
        }
      }
      else {
        QRegularExpressionMatch::capturedEnd
                  ((QRegularExpressionMatch *)in_stack_fffffffffffffc08,
                   CONCAT13(in_stack_fffffffffffffc07,
                            CONCAT12(in_stack_fffffffffffffc06,
                                     CONCAT11(in_stack_fffffffffffffc05,in_stack_fffffffffffffc04)))
                  );
        parseInstrument(this_00,in_RSI,(qsizetype)in_RDX);
      }
    }
    else {
      QRegularExpressionMatch::capturedEnd
                ((QRegularExpressionMatch *)in_stack_fffffffffffffc08,
                 CONCAT13(in_stack_fffffffffffffc07,
                          CONCAT12(in_stack_fffffffffffffc06,
                                   CONCAT11(in_stack_fffffffffffffc05,in_stack_fffffffffffffc04))));
      parseParamReplace(in_RDX,(QString *)CONCAT44(iVar6,in_stack_fffffffffffffc60),
                        (qsizetype)pQVar5,in_stack_fffffffffffffc50);
    }
    QString::~QString((QString *)0x110d9b);
    QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)0x110da8);
  }
  local_2b0.i = (Function *)0xaaaaaaaaaaaaaaaa;
  local_2b0 = QList<Function>::begin
                        ((QList<Function> *)
                         CONCAT17(in_stack_fffffffffffffc07,
                                  CONCAT16(in_stack_fffffffffffffc06,
                                           CONCAT15(in_stack_fffffffffffffc05,
                                                    CONCAT14(in_stack_fffffffffffffc04,
                                                             in_stack_fffffffffffffc00)))));
  local_2b8.i = (Function *)0xaaaaaaaaaaaaaaaa;
  local_2b8 = QList<Function>::end
                        ((QList<Function> *)
                         CONCAT17(in_stack_fffffffffffffc07,
                                  CONCAT16(in_stack_fffffffffffffc06,
                                           CONCAT15(in_stack_fffffffffffffc05,
                                                    CONCAT14(in_stack_fffffffffffffc04,
                                                             in_stack_fffffffffffffc00)))));
  while( true ) {
    local_2c0 = local_2b8.i;
    bVar1 = QList<Function>::iterator::operator!=(&local_2b0,local_2b8);
    if (!bVar1) break;
    QList<Function>::iterator::operator*(&local_2b0);
    local_2c8.i = (Replace *)0xaaaaaaaaaaaaaaaa;
    local_2c8 = QList<Replace>::begin
                          ((QList<Replace> *)
                           CONCAT17(in_stack_fffffffffffffc07,
                                    CONCAT16(in_stack_fffffffffffffc06,
                                             CONCAT15(in_stack_fffffffffffffc05,
                                                      CONCAT14(in_stack_fffffffffffffc04,
                                                               in_stack_fffffffffffffc00)))));
    o = QList<Replace>::end((QList<Replace> *)
                            CONCAT17(in_stack_fffffffffffffc07,
                                     CONCAT16(in_stack_fffffffffffffc06,
                                              CONCAT15(in_stack_fffffffffffffc05,
                                                       CONCAT14(in_stack_fffffffffffffc04,
                                                                in_stack_fffffffffffffc00)))));
    while (bVar1 = QList<Replace>::iterator::operator!=(&local_2c8,o), bVar1) {
      QList<Replace>::iterator::operator*(&local_2c8);
      QString::replace((QString *)in_RDI,(QString *)in_stack_fffffffffffffc28,
                       (QString *)in_stack_fffffffffffffc20,
                       (CaseSensitivity)((ulong)in_stack_fffffffffffffc18 >> 0x20));
      QList<Replace>::iterator::operator++(&local_2c8);
    }
    QList<Function>::iterator::operator++(&local_2b0);
  }
  QRegularExpression::~QRegularExpression((QRegularExpression *)0x110f56);
  QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
            ((QRegularExpressionMatchIterator *)0x110f63);
  QRegularExpression::~QRegularExpression((QRegularExpression *)0x110f70);
  QList<QString>::~QList((QList<QString> *)0x110f7d);
  QTextStream::~QTextStream
            ((QTextStream *)
             CONCAT17(in_stack_fffffffffffffc07,
                      CONCAT16(in_stack_fffffffffffffc06,
                               CONCAT15(in_stack_fffffffffffffc05,
                                        CONCAT14(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00
                                                )))));
  QString::~QString((QString *)0x110f97);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Parser::parse(QIODevice &input, const QString &name)
{
    QString data;
    QTextStream stream(&input);
    int lineNumber = 1;
    qsizetype prev = 0;
    while (!stream.atEnd()) {
        QString line = stream.readLine().trimmed();
        m_offsets.push_back({prev, prev + line.length(), lineNumber++});
        prev += line.length() + 1;
        data += line + QLatin1Char(QLatin1Char('\n'));
    }

    simplifyData(data, m_offsets);

    QStringList includes;

    QRegularExpression includeMacro(QStringLiteral("#include [\"<]([A-Za-z0-9_./-]*.h)[\">]"));
    QRegularExpressionMatchIterator i = includeMacro.globalMatch(data);
    while (i.hasNext()) {
        QRegularExpressionMatch match = i.next();
        const QString filename = match.captured(1);
        // only search possible qt headers
        if (filename.startsWith(QLatin1Char('q'), Qt::CaseInsensitive)) {
            const QString resolved = resolveInclude(filename);
            if (!resolved.isEmpty() && !includes.contains(resolved)) {
                includes.push_back(resolved);
                addIncludesRecursive(resolved, includes);
            }
        }
    }

    QRegularExpression traceMacro(QStringLiteral("Q_TRACE_([A-Z_]*)"));
    i = traceMacro.globalMatch(data);
    while (i.hasNext()) {
        QRegularExpressionMatch match = i.next();

        QString macroType = match.captured(1);
        if (macroType == QStringLiteral("PARAM_REPLACE"))
            parseParamReplace(data, match.capturedEnd(), name);
        else if (macroType == QStringLiteral("INSTRUMENT"))
            parseInstrument(data, match.capturedEnd());
        else if (macroType == QStringLiteral("POINT"))
            parsePoint(data, match.capturedEnd());
        else if (macroType == QStringLiteral("PREFIX"))
            parsePrefix(data, match.capturedEnd());
        else if (macroType == QStringLiteral("METADATA"))
            parseMetadata(data, match.capturedEnd(), includes);
    }

    for (auto &func : m_functions) {
        for (auto &rep : m_replaces)
            func.functionParameters.replace(rep.in, rep.out);
    }
}